

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SkylineBinPack.cpp
# Opt level: O2

Rect __thiscall
SkylineBinPack::FindPositionForNewNodeBottomLeft
          (SkylineBinPack *this,int width,int height,int *bestHeight,int *bestWidth,int *bestIndex)

{
  int iVar1;
  Rect RVar2;
  bool bVar3;
  SkylineNode *pSVar4;
  ulong uVar5;
  long lVar6;
  Rect newNode;
  int y;
  int *local_48;
  DisjointRectCollection *local_40;
  int *local_38;
  
  *bestHeight = 0x7fffffff;
  *bestIndex = -1;
  *bestWidth = 0x7fffffff;
  newNode.x = 0;
  newNode.y = 0;
  newNode.width = 0;
  newNode.height = 0;
  local_40 = &this->disjointRects;
  lVar6 = 8;
  uVar5 = 0;
  local_48 = bestWidth;
  local_38 = bestIndex;
  do {
    if ((this->skyLine).Count <= uVar5) {
      RVar2.y = newNode.y;
      RVar2.x = newNode.x;
      RVar2.width = newNode.width;
      RVar2.height = newNode.height;
      return RVar2;
    }
    bVar3 = RectangleFits(this,(int)uVar5,width,height,&y);
    if (bVar3) {
      iVar1 = y + height;
      if (iVar1 < *bestHeight) {
        pSVar4 = (this->skyLine).Array;
      }
      else if ((iVar1 != *bestHeight) ||
              (pSVar4 = (this->skyLine).Array, *local_48 <= *(int *)((long)&pSVar4->x + lVar6)))
      goto LAB_00325c07;
      *bestHeight = iVar1;
      *local_38 = (int)uVar5;
      *local_48 = *(int *)((long)&pSVar4->x + lVar6);
      newNode.x = *(int *)((long)pSVar4 + lVar6 + -8);
      newNode.y = y;
      newNode.width = width;
      newNode.height = height;
      bVar3 = DisjointRectCollection::Disjoint(local_40,&newNode);
      if (!bVar3) {
        __assert_fail("disjointRects.Disjoint(newNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/SkylineBinPack.cpp"
                      ,0x138,
                      "Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int, int, int &, int &, int &) const"
                     );
      }
    }
LAB_00325c07:
    uVar5 = uVar5 + 1;
    lVar6 = lVar6 + 0xc;
  } while( true );
}

Assistant:

Rect SkylineBinPack::FindPositionForNewNodeBottomLeft(int width, int height, int &bestHeight, int &bestWidth, int &bestIndex) const
{
	bestHeight = INT_MAX;
	bestIndex = -1;
	// Used to break ties if there are nodes at the same level. Then pick the narrowest one.
	bestWidth = INT_MAX;
	Rect newNode = { 0, 0, 0, 0 };
	for(unsigned i = 0; i < skyLine.Size(); ++i)
	{
		int y;
		if (RectangleFits(i, width, height, y))
		{
			if (y + height < bestHeight || (y + height == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + height;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = width;
				newNode.height = height;
#ifdef _DEBUG
				assert(disjointRects.Disjoint(newNode));
#endif
			}
		}
/*		if (RectangleFits(i, height, width, y))
		{
			if (y + width < bestHeight || (y + width == bestHeight && skyLine[i].width < bestWidth))
			{
				bestHeight = y + width;
				bestIndex = i;
				bestWidth = skyLine[i].width;
				newNode.x = skyLine[i].x;
				newNode.y = y;
				newNode.width = height;
				newNode.height = width;
				assert(disjointRects.Disjoint(newNode));
			}
		}
*/	}

	return newNode;
}